

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O0

int cmd_searchpath(char *arg)

{
  FILE *__stream;
  int iVar1;
  long lVar2;
  int *piVar3;
  char *pcVar4;
  bool bVar5;
  undefined1 local_c0 [8];
  stat st;
  int index;
  char **searchpaths;
  char *path;
  char *arg_local;
  
  searchpaths = (char **)strchr(arg,0x20);
  while( true ) {
    bVar5 = false;
    if (searchpaths != (char **)0x0) {
      bVar5 = *(char *)searchpaths == ' ';
    }
    if (!bVar5) break;
    searchpaths = (char **)((long)searchpaths + 1);
  }
  if ((searchpaths == (char **)0x0) || (*(char *)searchpaths == '\0')) {
    lVar2 = ly_ctx_get_searchdirs(ctx);
    if (lVar2 != 0) {
      st.__glibc_reserved[2]._4_4_ = 0;
      while (*(long *)(lVar2 + (long)st.__glibc_reserved[2]._4_4_ * 8) != 0) {
        fprintf(_stdout,"%s\n",*(undefined8 *)(lVar2 + (long)st.__glibc_reserved[2]._4_4_ * 8));
        st.__glibc_reserved[2]._4_4_ = st.__glibc_reserved[2]._4_4_ + 1;
      }
    }
    arg_local._4_4_ = 0;
  }
  else {
    iVar1 = strncmp((char *)searchpaths,"-h",2);
    if (((iVar1 == 0) &&
        ((*(char *)((long)searchpaths + 2) == '\0' || (*(char *)((long)searchpaths + 2) == ' '))))
       || ((iVar1 = strncmp((char *)searchpaths,"--help",6), iVar1 == 0 &&
           ((*(char *)((long)searchpaths + 6) == '\0' || (*(char *)((long)searchpaths + 6) == ' ')))
           ))) {
      cmd_searchpath_help();
      arg_local._4_4_ = 0;
    }
    else {
      iVar1 = strncmp((char *)searchpaths,"--clear",7);
      if ((iVar1 == 0) &&
         ((*(char *)((long)searchpaths + 7) == '\0' || (*(char *)((long)searchpaths + 7) == ' '))))
      {
        ly_ctx_unset_searchdirs(ctx,0xffffffff);
        arg_local._4_4_ = 0;
      }
      else {
        iVar1 = stat((char *)searchpaths,(stat *)local_c0);
        __stream = _stderr;
        if (iVar1 == -1) {
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          fprintf(__stream,"Failed to stat the search path (%s).\n",pcVar4);
          arg_local._4_4_ = 1;
        }
        else if (((uint)st.st_nlink & 0xf000) == 0x4000) {
          ly_ctx_set_searchdir(ctx,searchpaths);
          arg_local._4_4_ = 0;
        }
        else {
          fprintf(_stderr,"\"%s\" is not a directory.\n",searchpaths);
          arg_local._4_4_ = 1;
        }
      }
    }
  }
  return arg_local._4_4_;
}

Assistant:

int
cmd_searchpath(const char *arg)
{
    const char *path;
    const char * const *searchpaths;
    int index;
    struct stat st;

    for (path = strchr(arg, ' '); path && (path[0] == ' '); ++path);
    if (!path || (path[0] == '\0')) {
        searchpaths = ly_ctx_get_searchdirs(ctx);
        if (searchpaths) {
            for (index = 0; searchpaths[index]; index++) {
                fprintf(stdout, "%s\n", searchpaths[index]);
            }
        }
        return 0;
    }

    if ((!strncmp(path, "-h", 2) && (path[2] == '\0' || path[2] == ' ')) ||
        (!strncmp(path, "--help", 6) && (path[6] == '\0' || path[6] == ' '))) {
        cmd_searchpath_help();
        return 0;
    } else if (!strncmp(path, "--clear", 7) && (path[7] == '\0' || path[7] == ' ')) {
        ly_ctx_unset_searchdirs(ctx, -1);
        return 0;
    }

    if (stat(path, &st) == -1) {
        fprintf(stderr, "Failed to stat the search path (%s).\n", strerror(errno));
        return 1;
    }
    if (!S_ISDIR(st.st_mode)) {
        fprintf(stderr, "\"%s\" is not a directory.\n", path);
        return 1;
    }

    ly_ctx_set_searchdir(ctx, path);

    return 0;
}